

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

Container * __thiscall
IceCore::Container::FindNext(Container *this,udword *entry,FindMode find_mode)

{
  bool bVar1;
  uint uVar2;
  udword Location;
  uint local_1c;
  
  bVar1 = Contains(this,*entry,&local_1c);
  if (bVar1) {
    uVar2 = local_1c + 1;
    if ((local_1c + 1 == this->mCurNbEntries) && (uVar2 = local_1c, find_mode == FIND_WRAP)) {
      uVar2 = 0;
    }
    *entry = this->mEntries[uVar2];
  }
  return this;
}

Assistant:

Container& Container::FindNext(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location++;
		if(Location==mCurNbEntries)	Location = find_mode==FIND_WRAP ? 0 : mCurNbEntries-1;
		entry = mEntries[Location];
	}
	return *this;
}